

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  memberSetters;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  indexSetters;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elements;
  SourceRange sourceRange;
  StructuredAssignmentPatternExpression *pSVar1;
  undefined8 *in_RCX;
  size_t *in_RDX;
  Type *in_RSI;
  SourceLocation in_R9;
  size_t *in_stack_00000010;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff28;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  *in_stack_ffffffffffffff30;
  BumpAllocator *in_stack_ffffffffffffff38;
  StructuredAssignmentPatternExpression *this_00;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff90;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff98;
  Expression *defaultSetter;
  pointer ppEVar2;
  __extent_storage<18446744073709551615UL> _Var3;
  SourceLocation SVar4;
  
  pSVar1 = (StructuredAssignmentPatternExpression *)
           allocate(in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                    (size_t)in_stack_ffffffffffffff28);
  _Var3._M_extent_value = *in_RDX;
  SVar4 = *(SourceLocation *)(in_RDX + 1);
  defaultSetter = (Expression *)*in_RCX;
  ppEVar2 = (pointer)in_RCX[1];
  std::
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  ::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  this_00 = *(StructuredAssignmentPatternExpression **)in_R9;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_ffffffffffffff30,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff28);
  memberSetters._M_extent._M_extent_value = in_stack_ffffffffffffff80._M_extent_value;
  memberSetters._M_ptr = (pointer)in_stack_00000010[1];
  typeSetters._M_extent._M_extent_value = *in_stack_00000010;
  typeSetters._M_ptr = (pointer)pSVar1;
  indexSetters._M_extent._M_extent_value = in_stack_ffffffffffffff98._M_extent_value;
  indexSetters._M_ptr = in_stack_ffffffffffffff90;
  elements._M_extent._M_extent_value = _Var3._M_extent_value;
  elements._M_ptr = ppEVar2;
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = SVar4;
  slang::ast::StructuredAssignmentPatternExpression::StructuredAssignmentPatternExpression
            (this_00,in_RSI,memberSetters,typeSetters,indexSetters,defaultSetter,elements,
             sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }